

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::Normalizer2Impl::decompose
          (Normalizer2Impl *this,UnicodeString *src,UnicodeString *dest,UErrorCode *errorCode)

{
  short sVar1;
  char16_t *src_00;
  int destLengthEstimate;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    src_00 = UnicodeString::getBuffer(src);
    if (dest != src && src_00 != (char16_t *)0x0) {
      sVar1 = (src->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        destLengthEstimate = (src->fUnion).fFields.fLength;
      }
      else {
        destLengthEstimate = (int)sVar1 >> 5;
      }
      decompose(this,src_00,src_00 + destLengthEstimate,dest,destLengthEstimate,errorCode);
      return dest;
    }
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  UnicodeString::setToBogus(dest);
  return dest;
}

Assistant:

UnicodeString &
Normalizer2Impl::decompose(const UnicodeString &src, UnicodeString &dest,
                           UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) {
        dest.setToBogus();
        return dest;
    }
    const UChar *sArray=src.getBuffer();
    if(&dest==&src || sArray==NULL) {
        errorCode=U_ILLEGAL_ARGUMENT_ERROR;
        dest.setToBogus();
        return dest;
    }
    decompose(sArray, sArray+src.length(), dest, src.length(), errorCode);
    return dest;
}